

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExitNode.cpp
# Opt level: O2

bool __thiscall ExitNode::removeJoinSuccessor(ExitNode *this,JoinNode *joinNode)

{
  size_type sVar1;
  bool bVar2;
  JoinNode *local_28;
  ExitNode *local_20;
  
  if (joinNode == (JoinNode *)0x0) {
    bVar2 = false;
  }
  else {
    local_28 = joinNode;
    std::
    _Rb_tree<JoinNode_*,_JoinNode_*,_std::_Identity<JoinNode_*>,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>
    ::erase(&(this->joinSuccessors_)._M_t,&local_28);
    local_20 = this;
    sVar1 = std::
            _Rb_tree<const_ExitNode_*,_const_ExitNode_*,_std::_Identity<const_ExitNode_*>,_std::less<const_ExitNode_*>,_std::allocator<const_ExitNode_*>_>
            ::erase(&(local_28->joinPredecessors_)._M_t,&local_20);
    bVar2 = sVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool ExitNode::removeJoinSuccessor(JoinNode *joinNode) {
    if (!joinNode) {
        return false;
    }
    joinSuccessors_.erase(joinNode);
    return joinNode->joinPredecessors_.erase(this);
}